

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnklog.cpp
# Opt level: O3

void gnilk::Logger::EnableSink(string *name)

{
  LogManager *this;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  this = LogManager::Instance();
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<bool_(gnilk::LogSink_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:110:41)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<bool_(gnilk::LogSink_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/ext/gnklog/src/gnklog.cpp:110:41)>
             ::_M_manager;
  local_28._M_unused._M_object = name;
  LogManager::IterateSinks(this,(SinkDelegate *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return;
}

Assistant:

void Logger::EnableSink(const std::string &name) {
    LogManager::Instance().IterateSinks([&name](LogSink *sink) {
        if (name == sink->GetName()) {
            sink->SetEnabled(true);
            return false;
        }
        return true;
    });
}